

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodes.c
# Opt level: O1

void ror_66(void)

{
  ubyte uVar1;
  byte bVar2;
  
  uVar1 = carry_f;
  except = '\0';
  temp2 = getbyte(pc);
  bVar2 = RAM[temp2] >> 1;
  result_f = bVar2 + 0x80;
  if (uVar1 == '\0') {
    result_f = bVar2;
  }
  carry_f = RAM[temp2] & 1;
  RAM[temp2] = result_f;
  pc = pc + 1;
  return;
}

Assistant:

void ror_66(void) {
    ubyte oldcar;

    CLE;
    oldcar = carry_f;
    result_f = RAM[temp2 = getbyte(pc)];

    carry_f = result_f & 1;

    result_f >>= 1;

    if (oldcar) result_f |= 0x80;

    RAM[temp2] = result_f;
    pc++;
}